

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_done(connectdata *conn,CURLcode status,_Bool premature)

{
  FTP *pFVar1;
  CURLcode local_3c;
  CURLcode result;
  pop3_conn *pop3c;
  FTP *pop3;
  SessionHandle *data;
  _Bool premature_local;
  CURLcode status_local;
  connectdata *conn_local;
  
  pFVar1 = (conn->data->state).proto.ftp;
  local_3c = CURLE_OK;
  if (pFVar1 == (FTP *)0x0) {
    conn_local._4_4_ = CURLE_OK;
  }
  else {
    if (status != CURLE_OK) {
      (conn->bits).close = true;
      local_3c = status;
    }
    if ((conn->proto).ftpc.entrypath != (char *)0x0) {
      (*Curl_cfree)((conn->proto).ftpc.entrypath);
      (conn->proto).ftpc.entrypath = (char *)0x0;
    }
    if ((conn->proto).ftpc.dirs != (char **)0x0) {
      (*Curl_cfree)((conn->proto).ftpc.dirs);
      (conn->proto).ftpc.dirs = (char **)0x0;
    }
    pFVar1->transfer = FTPTRANSFER_BODY;
    conn_local._4_4_ = local_3c;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode pop3_done(struct connectdata *conn, CURLcode status,
                          bool premature)
{
  struct SessionHandle *data = conn->data;
  struct FTP *pop3 = data->state.proto.pop3;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  CURLcode result = CURLE_OK;

  (void)premature;

  if(!pop3)
    /* When the easy handle is removed from the multi while libcurl is still
     * trying to resolve the host name, it seems that the pop3 struct is not
     * yet initialized, but the removal action calls Curl_done() which calls
     * this function. So we simply return success if no pop3 pointer is set.
     */
    return CURLE_OK;

  if(status) {
    conn->bits.close = TRUE; /* marked for closure */
    result = status;         /* use the already set error code */
  }

  /* Cleanup our do based variables */
  Curl_safefree(pop3c->mailbox);
  Curl_safefree(pop3c->custom);

  /* Clear the transfer mode for the next connection */
  pop3->transfer = FTPTRANSFER_BODY;

  return result;
}